

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

void Abc_NtkFraigTransform(Abc_Ntk_t *pNtk,stmm_table *tEquiv,int fUseInv,int fVerbose)

{
  int iVar1;
  Abc_Obj_t *local_30;
  Abc_Obj_t *pList;
  stmm_generator *gen;
  int fVerbose_local;
  int fUseInv_local;
  stmm_table *tEquiv_local;
  Abc_Ntk_t *pNtk_local;
  
  if (tEquiv->num_entries != 0) {
    gen._0_4_ = fVerbose;
    gen._4_4_ = fUseInv;
    _fVerbose_local = tEquiv;
    tEquiv_local = (stmm_table *)pNtk;
    iVar1 = Abc_NtkHasMapping(pNtk);
    if (iVar1 == 0) {
      pList = (Abc_Obj_t *)stmm_init_gen(_fVerbose_local);
      while (iVar1 = stmm_gen((stmm_generator *)pList,(char **)&local_30,(char **)0x0), iVar1 != 0)
      {
        Abc_NtkFraigMergeClass((Abc_Ntk_t *)tEquiv_local,local_30,gen._4_4_,(int)gen);
      }
      stmm_free_gen((stmm_generator *)pList);
    }
    else {
      Abc_NtkDelayTrace((Abc_Ntk_t *)tEquiv_local,(Abc_Obj_t *)0x0,(Abc_Obj_t *)0x0,0);
      pList = (Abc_Obj_t *)stmm_init_gen(_fVerbose_local);
      while (iVar1 = stmm_gen((stmm_generator *)pList,(char **)&local_30,(char **)0x0), iVar1 != 0)
      {
        Abc_NtkFraigMergeClassMapped((Abc_Ntk_t *)tEquiv_local,local_30,gen._4_4_,(int)gen);
      }
      stmm_free_gen((stmm_generator *)pList);
    }
  }
  return;
}

Assistant:

void Abc_NtkFraigTransform( Abc_Ntk_t * pNtk, stmm_table * tEquiv, int fUseInv, int fVerbose )
{
    stmm_generator * gen;
    Abc_Obj_t * pList;
    if ( stmm_count(tEquiv) == 0 )
        return;
    // merge nodes in the classes
    if ( Abc_NtkHasMapping( pNtk ) )
    {
        Abc_NtkDelayTrace( pNtk, NULL, NULL, 0 );
        stmm_foreach_item( tEquiv, gen, (char **)&pList, NULL )
            Abc_NtkFraigMergeClassMapped( pNtk, pList, fUseInv, fVerbose );
    }
    else 
    {
        stmm_foreach_item( tEquiv, gen, (char **)&pList, NULL )
            Abc_NtkFraigMergeClass( pNtk, pList, fUseInv, fVerbose );
    }
}